

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.h
# Opt level: O2

void __thiscall libDAI::TFactor<double>::TFactor(TFactor<double> *this,TFactor<double> *x)

{
  VarSet::VarSet(&this->_vs,&x->_vs);
  std::vector<double,_std::allocator<double>_>::vector(&(this->_p)._p,&(x->_p)._p);
  return;
}

Assistant:

TFactor( const TFactor<T> &x ) : _vs(x._vs), _p(x._p) {}